

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O2

int jas_stream_write(jas_stream_t *stream,void *buf,uint cnt)

{
  uchar uVar1;
  uchar *puVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = jas_getdbglevel();
  if (99 < iVar3) {
    jas_eprintf("jas_stream_write(%p, %p, %d)\n",stream,buf,(ulong)cnt);
  }
  uVar4 = 0;
  do {
    if (cnt == (uint)uVar4) {
      uVar4 = (ulong)cnt;
LAB_001137e6:
      return (int)uVar4;
    }
    if ((stream->flags_ & 7U) != 0) goto LAB_001137e6;
    if ((-1 < stream->rwlimit_) && (stream->rwlimit_ <= stream->rwcnt_)) {
      stream->flags_ = stream->flags_ | 4;
      goto LAB_001137e6;
    }
    *(byte *)&stream->bufmode_ = (byte)stream->bufmode_ | 0x20;
    iVar3 = stream->cnt_;
    stream->cnt_ = iVar3 + -1;
    if (iVar3 < 1) {
      iVar3 = jas_stream_flushbuf(stream,(uint)*(byte *)((long)buf + uVar4));
      if (iVar3 == -1) goto LAB_001137e6;
    }
    else {
      stream->rwcnt_ = stream->rwcnt_ + 1;
      uVar1 = *(uchar *)((long)buf + uVar4);
      puVar2 = stream->ptr_;
      stream->ptr_ = puVar2 + 1;
      *puVar2 = uVar1;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int jas_stream_write(jas_stream_t *stream, const void *buf, unsigned cnt)
{
	const char *bufptr;

	JAS_DBGLOG(100, ("jas_stream_write(%p, %p, %d)\n", stream, buf, cnt));

	bufptr = buf;

	unsigned n = 0;
	while (n < cnt) {
		if (jas_stream_putc(stream, *bufptr) == EOF) {
			return n;
		}
		++bufptr;
		++n;
	}

	return n;
}